

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void __thiscall
dg::vr::RelationsAnalyzer::processOperation
          (RelationsAnalyzer *this,VRLocation *source,VRLocation *target,VROp *op)

{
  bool bVar1;
  RelationsAnalyzer *this_00;
  VRInstruction *in_RCX;
  long in_RDX;
  I in_RSI;
  ValueRelations *in_RDI;
  RelationsAnalyzer *unaff_retaddr;
  bool result;
  bool shouldMerge;
  I inst;
  ValueRelations *newGraph;
  VRAssumeBool *in_stack_000000d0;
  ValueRelations *in_stack_000000d8;
  ValueRelations *in_stack_000000e0;
  ValueRelations *in_stack_000000e8;
  Relations in_stack_000000f0;
  I in_stack_00000198;
  ValueRelations *in_stack_000001a0;
  ValueRelations *in_stack_000001a8;
  RelationsAnalyzer *in_stack_000001b0;
  VROp *in_stack_ffffffffffffffb0;
  VRAssumeEqual *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  ValueRelations *in_stack_ffffffffffffffc8;
  ValueRelations *in_stack_ffffffffffffffd0;
  
  if (in_RDX != 0) {
    this_00 = (RelationsAnalyzer *)(in_RDX + 8);
    bVar1 = VROp::isInstruction(&in_RCX->super_VROp);
    if (bVar1) {
      ValueRelations::merge(in_stack_000000e8,in_stack_000000e0,in_stack_000000f0);
      VRInstruction::getInstruction(in_RCX);
      rememberValidated(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
      processInstruction(unaff_retaddr,in_RDI,in_RSI);
    }
    else {
      bVar1 = VROp::isAssume(in_stack_ffffffffffffffb0);
      if (bVar1) {
        bVar1 = VROp::isAssumeBool(&in_RCX->super_VROp);
        if (bVar1) {
          bVar1 = processAssumeBool(this_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                                    (VRAssumeBool *)
                                    CONCAT17(in_stack_ffffffffffffffc7,
                                             CONCAT16(in_stack_ffffffffffffffc6,
                                                      in_stack_ffffffffffffffc0)));
        }
        else {
          bVar1 = processAssumeEqual(in_stack_ffffffffffffffc8,
                                     (ValueRelations *)
                                     CONCAT17(in_stack_ffffffffffffffc7,
                                              CONCAT16(in_stack_ffffffffffffffc6,
                                                       in_stack_ffffffffffffffc0)),
                                     in_stack_ffffffffffffffb8);
        }
        if (bVar1 != false) {
          ValueRelations::merge(in_stack_000000e8,in_stack_000000e0,in_stack_000000f0);
        }
        bVar1 = VROp::isAssumeBool(&in_RCX->super_VROp);
        if (bVar1) {
          inferFromNEPointers((RelationsAnalyzer *)in_stack_000000e0,in_stack_000000d8,
                              in_stack_000000d0);
        }
      }
      else {
        ValueRelations::merge(in_stack_000000e8,in_stack_000000e0,in_stack_000000f0);
      }
    }
  }
  return;
}

Assistant:

void RelationsAnalyzer::processOperation(VRLocation *source, VRLocation *target,
                                         VROp *op) {
    if (!target)
        return;
    assert(source && target && op);

    ValueRelations &newGraph = target->relations;

    if (op->isInstruction()) {
        newGraph.merge(source->relations, comparative);
        I inst = static_cast<VRInstruction *>(op)->getInstruction();
        rememberValidated(source->relations, newGraph, inst);
        processInstruction(newGraph, inst);

    } else if (op->isAssume()) {
        bool shouldMerge;
        if (op->isAssumeBool())
            shouldMerge = processAssumeBool(source->relations, newGraph,
                                            static_cast<VRAssumeBool *>(op));
        else // isAssumeEqual
            shouldMerge = processAssumeEqual(source->relations, newGraph,
                                             static_cast<VRAssumeEqual *>(op));
        if (shouldMerge) {
            __attribute__((unused)) bool result =
                    newGraph.merge(source->relations);
            assert(result);
        }

        if (op->isAssumeBool())
            inferFromNEPointers(newGraph, static_cast<VRAssumeBool *>(op));
    } else { // else op is noop
        newGraph.merge(source->relations, allRelations);
    }
}